

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall CGL::HalfedgeMesh::HalfedgeMesh(HalfedgeMesh *this,HalfedgeMesh *mesh)

{
  HalfedgeMesh *in_stack_00000468;
  HalfedgeMesh *in_stack_00000470;
  
  std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::list
            ((list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_> *)0x13e24d);
  std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::list
            ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)0x13e25f);
  std::__cxx11::list<CGL::Edge,_std::allocator<CGL::Edge>_>::list
            ((list<CGL::Edge,_std::allocator<CGL::Edge>_> *)0x13e272);
  std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::list
            ((list<CGL::Face,_std::allocator<CGL::Face>_> *)0x13e285);
  std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::list
            ((list<CGL::Face,_std::allocator<CGL::Face>_> *)0x13e298);
  operator=(in_stack_00000470,in_stack_00000468);
  return;
}

Assistant:

HalfedgeMesh::HalfedgeMesh(const HalfedgeMesh& mesh) { *this = mesh; }